

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

SearchFilesResult *
Diligent::LinuxFileSystem::Search(SearchFilesResult *__return_storage_ptr__,Char *SearchPattern)

{
  char *__file;
  int iVar1;
  FindFileData local_188;
  allocator local_149;
  String local_148;
  undefined1 local_128 [8];
  string FileName;
  stat StatBuff;
  char *path;
  undefined1 auStack_68 [4];
  uint i;
  glob_t glob_result;
  Char *SearchPattern_local;
  SearchFilesResult *SearchRes;
  
  glob_result.gl_stat._7_1_ = 0;
  std::vector<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>::vector
            (__return_storage_ptr__);
  memset(auStack_68,0,0x48);
  iVar1 = glob(SearchPattern,0x1000,(__errfunc *)0x0,(glob_t *)auStack_68);
  if (iVar1 == 0) {
    for (path._4_4_ = 0; path._4_4_ < _auStack_68; path._4_4_ = path._4_4_ + 1) {
      __file = *(char **)(glob_result.gl_pathc + (ulong)path._4_4_ * 8);
      FileName.field_2._8_8_ = 0;
      stat(__file,(stat *)((long)&FileName.field_2 + 8));
      std::__cxx11::string::string((string *)local_128);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,__file,&local_149);
      BasicFileSystem::GetPathComponents(&local_148,(String *)0x0,(String *)local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::string((string *)&local_188,(string *)local_128);
      local_188.IsDirectory = false;
      std::vector<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>::
      emplace_back<Diligent::FindFileData>(__return_storage_ptr__,&local_188);
      FindFileData::~FindFileData(&local_188);
      std::__cxx11::string::~string((string *)local_128);
    }
  }
  globfree((glob_t *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

LinuxFileSystem::SearchFilesResult LinuxFileSystem::Search(const Char* SearchPattern)
{
    LinuxFileSystem::SearchFilesResult SearchRes;

#if PLATFORM_LINUX || PLATFORM_APPLE
    glob_t glob_result = {};
    if (glob(SearchPattern, GLOB_TILDE, NULL, &glob_result) == 0)
    {
        for (unsigned int i = 0; i < glob_result.gl_pathc; ++i)
        {
            const auto* path = glob_result.gl_pathv[i];

            struct stat StatBuff = {};
            stat(path, &StatBuff);

            std::string FileName;
            GetPathComponents(path, nullptr, &FileName);
            SearchRes.emplace_back(FindFileData{std::move(FileName), S_ISDIR(StatBuff.st_mode)});
        }
    }
    globfree(&glob_result);
#else
    UNSUPPORTED("Not implemented");
#endif

    return SearchRes;
}